

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  element_type *peVar2;
  int iVar3;
  ExpectationBase **ppEVar4;
  _Rb_tree_node_base *p_Var5;
  bool bVar6;
  ExpectationBase *__tmp;
  ExpectationBase *next;
  ExpectationBase *local_40;
  ExpectationBase **local_38;
  iterator local_30;
  ExpectationBase **local_28;
  
  ppEVar4 = (ExpectationBase **)operator_new(8);
  local_30._M_current = ppEVar4 + 1;
  *ppEVar4 = this;
  local_38 = ppEVar4;
  local_28 = local_30._M_current;
  do {
    pEVar1 = local_30._M_current[-1];
    local_30._M_current = local_30._M_current + -1;
    p_Var5 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    while ((_Rb_tree_header *)p_Var5 !=
           &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header) {
      local_40 = *(ExpectationBase **)(p_Var5 + 1);
      peVar2 = (local_40->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)local_40->call_count_);
      if ((char)iVar3 == '\0') {
        bVar6 = false;
        ppEVar4 = local_38;
        goto LAB_001a846b;
      }
      if (local_30._M_current == local_28) {
        std::
        vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
        ::_M_realloc_insert<testing::internal::ExpectationBase_const*const&>
                  ((vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
                    *)&local_38,local_30,&local_40);
      }
      else {
        *local_30._M_current = local_40;
        local_30._M_current = local_30._M_current + 1;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      ppEVar4 = local_38;
    }
  } while (ppEVar4 != local_30._M_current);
  bVar6 = true;
LAB_001a846b:
  if (ppEVar4 != (ExpectationBase **)0x0) {
    operator_delete(ppEVar4,(long)local_28 - (long)ppEVar4);
  }
  return bVar6;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}